

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::ProcessCurrentModule(GraphicsRobustAccessPass *this)

{
  undefined1 *puVar1;
  bool bVar2;
  spv_result_t sVar3;
  ProcessFunction fn;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  sVar3 = IsCompatibleModule(this);
  if (sVar3 == SPV_SUCCESS) {
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp:220:24)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp:220:24)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    bVar2 = IRContext::ProcessReachableCallTree
                      ((this->super_Pass).context_,(ProcessFunction *)&local_38);
    puVar1 = &(this->super_Pass).field_0x34;
    *puVar1 = *puVar1 | bVar2;
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    sVar3 = SPV_SUCCESS;
  }
  return sVar3;
}

Assistant:

spv_result_t GraphicsRobustAccessPass::ProcessCurrentModule() {
  auto err = IsCompatibleModule();
  if (err != SPV_SUCCESS) return err;

  ProcessFunction fn = [this](opt::Function* f) { return ProcessAFunction(f); };
  module_status_.modified |= context()->ProcessReachableCallTree(fn);

  // Need something here.  It's the price we pay for easier failure paths.
  return SPV_SUCCESS;
}